

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::endElement
          (AbstractDOMParser *this,XMLElementDecl *param_1,uint param_2,bool param_3,XMLCh *param_4)

{
  DOMNode *sourceNode;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLScanner *this_00;
  XMLEntityHandler *entityResolver;
  undefined4 extraout_var_02;
  DOMDocument *local_78;
  DOMNode *local_60;
  undefined1 local_40 [8];
  XIncludeUtils xiu;
  XMLCh *param_4_local;
  bool param_3_local;
  uint param_2_local;
  XMLElementDecl *param_1_local;
  AbstractDOMParser *this_local;
  
  this->fCurrentNode = this->fCurrentParent;
  xiu.fErrorReporter = (XMLErrorReporter *)param_4;
  iVar2 = (*this->fCurrentNode->_vptr_DOMNode[5])();
  this->fCurrentParent = (DOMNode *)CONCAT44(extraout_var,iVar2);
  if ((this->fCurrentParent == (DOMNode *)0x0) && (this->fDocument != (DOMDocumentImpl *)0x0)) {
    iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x40])();
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    this->fCurrentParent = this->fCurrentNode;
  }
  local_60 = (DOMNode *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_60 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  }
  if (this->fCurrentParent == local_60) {
    this->fWithinElement = false;
  }
  if ((this->fDoXInclude & 1U) == 0) {
    return;
  }
  bVar1 = XIncludeUtils::isXIIncludeDOMNode(this->fCurrentNode);
  if (!bVar1) {
    bVar1 = XIncludeUtils::isXIFallbackDOMNode(this->fCurrentNode);
    if (!bVar1) {
      return;
    }
    iVar2 = (*this->fCurrentParent->_vptr_DOMNode[0x16])();
    bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar2),
                              (XMLCh *)XIncludeUtils::fgXIIIncludeNamespaceURI);
    if (bVar1) {
      return;
    }
  }
  XIncludeUtils::XIncludeUtils((XIncludeUtils *)local_40,&this->super_XMLErrorReporter);
  sourceNode = this->fCurrentNode;
  local_78 = (DOMDocument *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_78 = &this->fDocument->super_DOMDocument;
  }
  this_00 = getScanner(this);
  entityResolver = XMLScanner::getEntityHandler(this_00);
  bVar1 = XIncludeUtils::parseDOMNodeDoingXInclude
                    ((XIncludeUtils *)local_40,sourceNode,local_78,entityResolver);
  if (bVar1) {
    iVar2 = (*this->fCurrentParent->_vptr_DOMNode[8])();
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_02,iVar2);
  }
  XIncludeUtils::~XIncludeUtils((XIncludeUtils *)local_40);
  return;
}

Assistant:

void AbstractDOMParser::endElement( const   XMLElementDecl&
                           , const unsigned int
                           , const bool
                           , const XMLCh* const)
{
    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // When the document is invalid but we continue parsing, we may
    // end up seeing more 'end' events than the 'start' ones.
    //
    if (fCurrentParent == 0 && fDocument != 0)
    {
      fCurrentNode = fDocument->getDocumentElement ();
      fCurrentParent = fCurrentNode;
    }

    // If we've hit the end of content, clear the flag.
    //
    if (fCurrentParent == fDocument)
        fWithinElement = false;

    if(fDoXInclude &&
       (XIncludeUtils::isXIIncludeDOMNode(fCurrentNode) ||
        ((XIncludeUtils::isXIFallbackDOMNode(fCurrentNode) &&
          !XMLString::equals(fCurrentParent->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)))))
    {
    	XIncludeUtils xiu((XMLErrorReporter *) this);
	    // process the XInclude node, then update the fCurrentNode with the new content
	    if(xiu.parseDOMNodeDoingXInclude(fCurrentNode, fDocument, getScanner()->getEntityHandler()))
            fCurrentNode = fCurrentParent->getLastChild();
    }
}